

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O2

void __thiscall TreeItem::~TreeItem(TreeItem *this)

{
  TreeItem *this_00;
  TreeItem *pTVar1;
  
  pTVar1 = this;
  while (pTVar1 = (TreeItem *)
                  (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next, pTVar1 != this) {
    this_00 = (TreeItem *)
              (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl
              ._M_node._M_size;
    if (this_00 != (TreeItem *)0x0) {
      ~TreeItem(this_00);
    }
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->itemUncompressedData);
  std::__cxx11::string::~string((string *)&this->itemParsingData);
  std::__cxx11::string::~string((string *)&this->itemTail);
  std::__cxx11::string::~string((string *)&this->itemBody);
  std::__cxx11::string::~string((string *)&this->itemHeader);
  Bstrlib::CBString::~CBString(&this->itemInfo);
  Bstrlib::CBString::~CBString(&this->itemText);
  Bstrlib::CBString::~CBString(&this->itemName);
  std::__cxx11::_List_base<TreeItem_*,_std::allocator<TreeItem_*>_>::_M_clear
            ((_List_base<TreeItem_*,_std::allocator<TreeItem_*>_> *)this);
  return;
}

Assistant:

TreeItem::~TreeItem() {
    std::list<TreeItem*>::iterator begin = childItems.begin();
    while (begin != childItems.end()) {
        delete *begin;
        ++begin;
    }
}